

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutex_art.hpp
# Opt level: O3

pair<std::optional<std::span<const_std::byte,_18446744073709551615UL>_>,_std::unique_lock<std::mutex>_>
* __thiscall
unodb::mutex_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::get_internal
          (pair<std::optional<std::span<const_std::byte,_18446744073709551615UL>_>,_std::unique_lock<std::mutex>_>
           *__return_storage_ptr__,
          mutex_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_> *this,
          art_key_type k)

{
  unique_lock<std::mutex> local_60;
  undefined1 auStack_50 [8];
  get_result db_get_result;
  unique_lock<std::mutex> guard;
  
  db_get_result.super__Optional_base<std::span<const_std::byte,_18446744073709551615UL>,_true,_true>
  ._M_payload.super__Optional_payload_base<std::span<const_std::byte,_18446744073709551615UL>_>.
  _16_8_ = &this->mutex;
  std::unique_lock<std::mutex>::lock
            ((unique_lock<std::mutex> *)
             &db_get_result.
              super__Optional_base<std::span<const_std::byte,_18446744073709551615UL>,_true,_true>.
              _M_payload.
              super__Optional_payload_base<std::span<const_std::byte,_18446744073709551615UL>_>.
              _M_engaged);
  db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::get_internal
            ((get_result *)auStack_50,&this->db_,(art_key_type)k.field_0);
  if (db_get_result.
      super__Optional_base<std::span<const_std::byte,_18446744073709551615UL>,_true,_true>.
      _M_payload.super__Optional_payload_base<std::span<const_std::byte,_18446744073709551615UL>_>.
      _M_payload._M_value._M_extent._M_extent_value._0_1_ == '\0') {
    std::unique_lock<std::mutex>::unlock
              ((unique_lock<std::mutex> *)
               &db_get_result.
                super__Optional_base<std::span<const_std::byte,_18446744073709551615UL>,_true,_true>
                ._M_payload.
                super__Optional_payload_base<std::span<const_std::byte,_18446744073709551615UL>_>.
                _M_engaged);
    *(ulong *)&(__return_storage_ptr__->first).
               super__Optional_base<std::span<const_std::byte,_18446744073709551615UL>,_true,_true>.
               _M_payload.
               super__Optional_payload_base<std::span<const_std::byte,_18446744073709551615UL>_>.
               _M_engaged =
         CONCAT71(db_get_result.
                  super__Optional_base<std::span<const_std::byte,_18446744073709551615UL>,_true,_true>
                  ._M_payload.
                  super__Optional_payload_base<std::span<const_std::byte,_18446744073709551615UL>_>.
                  _M_payload._M_value._M_extent._M_extent_value._1_7_,
                  db_get_result.
                  super__Optional_base<std::span<const_std::byte,_18446744073709551615UL>,_true,_true>
                  ._M_payload.
                  super__Optional_payload_base<std::span<const_std::byte,_18446744073709551615UL>_>.
                  _M_payload._M_value._M_extent._M_extent_value._0_1_);
    (__return_storage_ptr__->first).
    super__Optional_base<std::span<const_std::byte,_18446744073709551615UL>,_true,_true>._M_payload.
    super__Optional_payload_base<std::span<const_std::byte,_18446744073709551615UL>_>._M_payload.
    _M_value._M_ptr = (pointer)auStack_50;
    (__return_storage_ptr__->first).
    super__Optional_base<std::span<const_std::byte,_18446744073709551615UL>,_true,_true>._M_payload.
    super__Optional_payload_base<std::span<const_std::byte,_18446744073709551615UL>_>._M_payload.
    _M_value._M_extent._M_extent_value =
         (size_t)db_get_result.
                 super__Optional_base<std::span<const_std::byte,_18446744073709551615UL>,_true,_true>
                 ._M_payload.
                 super__Optional_payload_base<std::span<const_std::byte,_18446744073709551615UL>_>.
                 _M_payload._M_value._M_ptr;
    (__return_storage_ptr__->second)._M_device = (mutex_type *)0x0;
    (__return_storage_ptr__->second)._M_owns = false;
    local_60._M_device = (mutex_type *)0x0;
    local_60._M_owns = false;
    std::unique_lock<std::mutex>::~unique_lock(&local_60);
  }
  else {
    *(ulong *)&(__return_storage_ptr__->first).
               super__Optional_base<std::span<const_std::byte,_18446744073709551615UL>,_true,_true>.
               _M_payload.
               super__Optional_payload_base<std::span<const_std::byte,_18446744073709551615UL>_>.
               _M_engaged =
         CONCAT71(db_get_result.
                  super__Optional_base<std::span<const_std::byte,_18446744073709551615UL>,_true,_true>
                  ._M_payload.
                  super__Optional_payload_base<std::span<const_std::byte,_18446744073709551615UL>_>.
                  _M_payload._M_value._M_extent._M_extent_value._1_7_,
                  db_get_result.
                  super__Optional_base<std::span<const_std::byte,_18446744073709551615UL>,_true,_true>
                  ._M_payload.
                  super__Optional_payload_base<std::span<const_std::byte,_18446744073709551615UL>_>.
                  _M_payload._M_value._M_extent._M_extent_value._0_1_);
    (__return_storage_ptr__->first).
    super__Optional_base<std::span<const_std::byte,_18446744073709551615UL>,_true,_true>._M_payload.
    super__Optional_payload_base<std::span<const_std::byte,_18446744073709551615UL>_>._M_payload.
    _M_value._M_ptr = (pointer)auStack_50;
    (__return_storage_ptr__->first).
    super__Optional_base<std::span<const_std::byte,_18446744073709551615UL>,_true,_true>._M_payload.
    super__Optional_payload_base<std::span<const_std::byte,_18446744073709551615UL>_>._M_payload.
    _M_value._M_extent._M_extent_value =
         (size_t)db_get_result.
                 super__Optional_base<std::span<const_std::byte,_18446744073709551615UL>,_true,_true>
                 ._M_payload.
                 super__Optional_payload_base<std::span<const_std::byte,_18446744073709551615UL>_>.
                 _M_payload._M_value._M_ptr;
    (__return_storage_ptr__->second)._M_device =
         (mutex_type *)
         db_get_result.
         super__Optional_base<std::span<const_std::byte,_18446744073709551615UL>,_true,_true>.
         _M_payload.
         super__Optional_payload_base<std::span<const_std::byte,_18446744073709551615UL>_>._16_8_;
    (__return_storage_ptr__->second)._M_owns = true;
    db_get_result.
    super__Optional_base<std::span<const_std::byte,_18446744073709551615UL>,_true,_true>._M_payload.
    super__Optional_payload_base<std::span<const_std::byte,_18446744073709551615UL>_>._M_engaged =
         false;
    db_get_result.
    super__Optional_base<std::span<const_std::byte,_18446744073709551615UL>,_true,_true>._M_payload.
    super__Optional_payload_base<std::span<const_std::byte,_18446744073709551615UL>_>._17_7_ = 0;
  }
  std::unique_lock<std::mutex>::~unique_lock
            ((unique_lock<std::mutex> *)
             &db_get_result.
              super__Optional_base<std::span<const_std::byte,_18446744073709551615UL>,_true,_true>.
              _M_payload.
              super__Optional_payload_base<std::span<const_std::byte,_18446744073709551615UL>_>.
              _M_engaged);
  return __return_storage_ptr__;
}

Assistant:

[[nodiscard]] auto get_internal(art_key_type k) const noexcept {
    std::unique_lock guard{mutex};
    const auto db_get_result{db_.get_internal(k)};
    if (!db_get_result) {
      guard.unlock();
      return std::make_pair(db_get_result, std::unique_lock<std::mutex>{});
    }
    return std::make_pair(db_get_result, std::move(guard));
  }